

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fftrun(fitsfile *fptr,LONGLONG filesize,int *status)

{
  int *in_RDX;
  LONGLONG in_RSI;
  fitsfile *in_RDI;
  int local_4;
  
  if (driverTable[in_RDI->Fptr->driver].truncate == (_func_int_int_LONGLONG *)0x0) {
    local_4 = *in_RDX;
  }
  else {
    ffflsh(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
    in_RDI->Fptr->filesize = in_RSI;
    in_RDI->Fptr->io_pos = in_RSI;
    in_RDI->Fptr->logfilesize = in_RSI;
    in_RDI->Fptr->bytepos = in_RSI;
    ffbfeof(in_RDI,in_RDX);
    local_4 = (*driverTable[in_RDI->Fptr->driver].truncate)(in_RDI->Fptr->filehandle,in_RSI);
    *in_RDX = local_4;
  }
  return local_4;
}

Assistant:

int fftrun( fitsfile *fptr,    /* I - FITS file pointer           */
             LONGLONG filesize,   /* I - size to truncate the file   */
             int *status)      /* O - error status                */
/*
  low level routine to truncate a file to a new smaller size.
*/
{
  if (driverTable[(fptr->Fptr)->driver].truncate)
  {
    ffflsh(fptr, FALSE, status);  /* flush all the buffers first */
    (fptr->Fptr)->filesize = filesize;
    (fptr->Fptr)->io_pos = filesize;
    (fptr->Fptr)->logfilesize = filesize;
    (fptr->Fptr)->bytepos = filesize;
    ffbfeof(fptr, status);   /* eliminate any buffers beyond current EOF */
    return (*status = 
     (*driverTable[(fptr->Fptr)->driver].truncate)((fptr->Fptr)->filehandle,
     filesize) );
  }
  else
    return(*status);
}